

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::SectionInfo::~SectionInfo(SectionInfo *this)

{
  SectionInfo *this_local;
  
  SourceLineInfo::~SourceLineInfo(&this->lineInfo);
  std::__cxx11::string::~string((string *)&this->description);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

SectionInfo(    std::string const& _name,
                        std::string const& _description,
                        SourceLineInfo const& _lineInfo )
        :   name( _name ),
            description( _description ),
            lineInfo( _lineInfo )
        {}